

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

void sysbvm_tuple_byteSlotAtPut
               (sysbvm_context_t *context,sysbvm_tuple_t tuple,size_t slotIndex,uint8_t value)

{
  _Bool _Var1;
  size_t sVar2;
  uint8_t value_local;
  size_t slotIndex_local;
  sysbvm_tuple_t tuple_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(tuple);
  if (!_Var1) {
    sysbvm_error_modifyImmediateValue();
  }
  _Var1 = sysbvm_tuple_isDummyValue(tuple);
  if (_Var1) {
    sysbvm_error_accessDummyValue();
  }
  _Var1 = sysbvm_tuple_isImmediate(tuple);
  if (_Var1) {
    sysbvm_error_modifyImmutableTuple();
  }
  _Var1 = sysbvm_tuple_isBytes(tuple);
  if (!_Var1) {
    sysbvm_error("Expected a byte tuple.");
  }
  sVar2 = sysbvm_tuple_getSizeInBytes(tuple);
  if (slotIndex < sVar2) {
    *(uint8_t *)(tuple + 0x10 + slotIndex) = value;
  }
  else {
    sysbvm_error_outOfBoundsSlotAccess();
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_tuple_byteSlotAtPut(sysbvm_context_t *context, sysbvm_tuple_t tuple, size_t slotIndex, uint8_t value)
{
    (void)context;
    if(!sysbvm_tuple_isNonNullPointer(tuple)) sysbvm_error_modifyImmediateValue();
    if(sysbvm_tuple_isDummyValue(tuple)) sysbvm_error_accessDummyValue();
    if(sysbvm_tuple_isImmediate(tuple)) sysbvm_error_modifyImmutableTuple();

    if(!sysbvm_tuple_isBytes(tuple))
        sysbvm_error("Expected a byte tuple.");

    if(slotIndex < sysbvm_tuple_getSizeInBytes(tuple))
        SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->bytes[slotIndex] = value;
    else
        sysbvm_error_outOfBoundsSlotAccess();
}